

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O2

Instruction *
Hpipe::InstructionCond::make_cond
          (Node *node,PtrPool<Hpipe::Instruction,_32> *inst_pool,Cond *not_in,bool in_a_cycle,
          InstructionMark *mark,int off_data)

{
  Vec<Hpipe::Transition> *pVVar1;
  uchar b;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  InstructionMark *pIVar5;
  InstructionCond *pIVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  undefined7 in_register_00000009;
  undefined1 uVar9;
  Cond cond;
  Cond local_108;
  undefined4 local_e4;
  InstructionCond *local_e0;
  Instruction *local_d8;
  vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *local_d0;
  InstructionMark *local_c8;
  Context local_c0;
  Cond local_50;
  undefined4 uVar10;
  
  pNVar2 = (node->ok).data;
  if (pNVar2 == (Node *)0x0) {
    return node->inst;
  }
  local_e4 = (undefined4)CONCAT71(in_register_00000009,in_a_cycle);
  local_e0 = (InstructionCond *)pNVar2->freq;
  local_d8 = (Instruction *)((node->ko).data)->freq;
  local_c8 = mark;
  if (node->use_equ == true) {
    b = (uchar)node->beg;
    Cond::Cond(&local_50,b,b);
    pIVar6 = (InstructionCond *)operator_new(0x1c0);
    local_d0 = (vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)
               CONCAT44(local_d0._4_4_,off_data);
    if ((double)local_d8 <= (double)local_e0) {
      Context::Context(&local_c0,0);
      InstructionCond(pIVar6,&local_c0,&local_50,off_data,not_in);
      local_e0 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
      Context::~Context(&local_c0);
      pNVar2 = (node->ok).data;
      Cond::operator~(&local_108,&local_50);
      Cond::operator|((Cond *)&local_c0,not_in,&local_108);
      pIVar5 = local_c8;
      iVar4 = (int)local_d0;
      pIVar8 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,in_a_cycle,local_c8,(int)local_d0);
      pNVar2 = (node->ko).data;
      local_d8 = (Instruction *)inst_pool;
      Cond::operator|((Cond *)&local_c0,not_in,&local_50);
      pIVar7 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)local_d8,(Cond *)&local_c0,
                         in_a_cycle,pIVar5,iVar4);
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,pIVar8,(Vec<unsigned_int> *)&local_108,
                 ((node->ok).data)->freq);
      pIVar6 = local_e0;
      pVVar1 = &(local_e0->super_Instruction).next;
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
                 -1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar8->prev,
                 (Transition *)&local_c0);
      uVar10 = local_e4;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,pIVar7,(Vec<unsigned_int> *)&local_108,
                 ((node->ko).data)->freq);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
                 -1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar7->prev,
                 (Transition *)&local_c0);
    }
    else {
      Context::Context(&local_c0,0);
      Cond::operator~(&local_108,&local_50);
      InstructionCond(pIVar6,&local_c0,&local_108,off_data,not_in);
      local_e0 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
      Context::~Context(&local_c0);
      pNVar2 = (node->ko).data;
      Cond::operator|((Cond *)&local_c0,not_in,&local_50);
      pIVar5 = local_c8;
      bVar3 = local_e4._0_1_;
      local_d8 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,local_e4._0_1_,local_c8,off_data);
      pNVar2 = (node->ok).data;
      Cond::operator~(&local_108,&local_50);
      Cond::operator|((Cond *)&local_c0,not_in,&local_108);
      pIVar7 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,bVar3,pIVar5,(int)local_d0);
      pIVar8 = local_d8;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,local_d8,(Vec<unsigned_int> *)&local_108,
                 ((node->ko).data)->freq);
      pIVar6 = local_e0;
      local_d0 = (vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)
                 &(local_e0->super_Instruction).next;
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>(local_d0,(Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
                 -1.0);
      uVar10 = local_e4;
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar8->prev,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,pIVar7,(Vec<unsigned_int> *)&local_108,
                 ((node->ok).data)->freq);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>(local_d0,(Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
                 -1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar7->prev,
                 (Transition *)&local_c0);
    }
  }
  else {
    Cond::Cond(&local_50,(uchar)node->beg,0xff);
    pIVar6 = (InstructionCond *)operator_new(0x1c0);
    if ((double)local_d8 <= (double)local_e0) {
      Context::Context(&local_c0,0);
      Cond::operator~(&local_108,&local_50);
      InstructionCond(pIVar6,&local_c0,&local_108,off_data,not_in);
      local_e0 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
      Context::~Context(&local_c0);
      pNVar2 = (node->ok).data;
      Cond::operator|((Cond *)&local_c0,not_in,&local_50);
      pIVar5 = local_c8;
      bVar3 = local_e4._0_1_;
      local_d8 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,local_e4._0_1_,local_c8,off_data);
      pNVar2 = (node->ko).data;
      Cond::operator~(&local_108,&local_50);
      Cond::operator|((Cond *)&local_c0,not_in,&local_108);
      pIVar8 = local_d8;
      pIVar7 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,bVar3,pIVar5,off_data);
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,pIVar8,(Vec<unsigned_int> *)&local_108,
                 ((node->ok).data)->freq);
      pIVar6 = local_e0;
      pVVar1 = &(local_e0->super_Instruction).next;
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
                 -1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar8->prev,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      Transition::Transition
                ((Transition *)&local_c0,pIVar7,(Vec<unsigned_int> *)&local_108,
                 ((node->ko).data)->freq);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
      local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
      Transition::Transition
                ((Transition *)&local_c0,&local_e0->super_Instruction,
                 (Vec<unsigned_int> *)&local_108,-1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar7->prev,
                 (Transition *)&local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&local_c0.pos.
                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         .
                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                         ._M_impl.super__Vector_impl_data + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      uVar9 = (undefined1)local_e4;
      goto LAB_0015fdd3;
    }
    Context::Context(&local_c0,0);
    local_d0 = (vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)
               CONCAT44(local_d0._4_4_,off_data);
    InstructionCond(pIVar6,&local_c0,&local_50,off_data,not_in);
    local_e0 = PtrPool<Hpipe::Instruction,32>::operator<<
                         ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar6);
    Context::~Context(&local_c0);
    pNVar2 = (node->ko).data;
    Cond::operator~(&local_108,&local_50);
    Cond::operator|((Cond *)&local_c0,not_in,&local_108);
    pIVar5 = local_c8;
    iVar4 = (int)local_d0;
    pIVar8 = make_cond(pNVar2,inst_pool,(Cond *)&local_c0,in_a_cycle,local_c8,(int)local_d0);
    pNVar2 = (node->ok).data;
    local_d8 = (Instruction *)inst_pool;
    Cond::operator|((Cond *)&local_c0,not_in,&local_50);
    pIVar7 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)local_d8,(Cond *)&local_c0,
                       in_a_cycle,pIVar5,iVar4);
    local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
    Transition::Transition
              ((Transition *)&local_c0,pIVar8,(Vec<unsigned_int> *)&local_108,
               ((node->ko).data)->freq);
    pIVar6 = local_e0;
    pVVar1 = &(local_e0->super_Instruction).next;
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
               (Transition *)&local_c0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&local_c0.pos.
                       super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       .
                       super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       ._M_impl.super__Vector_impl_data + 8));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
    Transition::Transition
              ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
               -1.0);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar8->prev,
               (Transition *)&local_c0);
    uVar10 = local_e4;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&local_c0.pos.
                       super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       .
                       super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       ._M_impl.super__Vector_impl_data + 8));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
    Transition::Transition
              ((Transition *)&local_c0,pIVar7,(Vec<unsigned_int> *)&local_108,
               ((node->ok).data)->freq);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
               (Transition *)&local_c0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&local_c0.pos.
                       super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       .
                       super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                       ._M_impl.super__Vector_impl_data + 8));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    local_108.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[1] = 0;
    local_108.p.super__Base_bitset<4UL>._M_w[2] = 0;
    Transition::Transition
              ((Transition *)&local_c0,&pIVar6->super_Instruction,(Vec<unsigned_int> *)&local_108,
               -1.0);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar7->prev,
               (Transition *)&local_c0);
  }
  uVar9 = (undefined1)uVar10;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&local_c0.pos.
                     super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                     .
                     super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                     ._M_impl.super__Vector_impl_data + 8));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  local_e0 = pIVar6;
LAB_0015fdd3:
  (local_e0->super_Instruction).in_a_cycle = (bool)uVar9;
  (local_e0->super_Instruction).mark = local_c8;
  return &local_e0->super_Instruction;
}

Assistant:

Instruction *InstructionCond::make_cond( const BranchSet::Node *node, PtrPool<Instruction> &inst_pool, const Cond &not_in, bool in_a_cycle, InstructionMark *mark, int off_data ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            Cond cond( node->beg, node->beg );
            if ( use_neg ) {
                Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
                Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
                Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
                res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
                res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
                res->in_a_cycle = in_a_cycle;
                res->mark = mark;
                return res;
            }
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Cond cond( node->beg, 255 );
        if ( use_neg ) {
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
        Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
        Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
        res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
        res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
        res->in_a_cycle = in_a_cycle;
        res->mark = mark;
        return res;
    }
    return node->inst;
}